

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall slang::parsing::Parser::isHierarchyInstantiation(Parser *this,bool requireName)

{
  bool bVar1;
  uint32_t uVar2;
  Token TVar3;
  uint32_t local_1c;
  
  local_1c = 1;
  TVar3 = ParserBase::peek(&this->super_ParserBase,0);
  if (TVar3.kind != Identifier) {
    return false;
  }
  TVar3 = ParserBase::peek(&this->super_ParserBase,1);
  uVar2 = 1;
  if (TVar3.kind == Hash) {
    TVar3 = ParserBase::peek(&this->super_ParserBase,2);
    if (TVar3.kind != OpenParenthesis) {
      return false;
    }
    local_1c = 3;
    bVar1 = scanTypePart<&slang::syntax::SyntaxFacts::isNotInType>
                      (this,&local_1c,OpenParenthesis,CloseParenthesis);
    uVar2 = local_1c;
    if (!bVar1) {
      return false;
    }
  }
  TVar3 = ParserBase::peek(&this->super_ParserBase,uVar2);
  if (TVar3.kind == Identifier) {
    local_1c = local_1c + 1;
    bVar1 = scanDimensionList(this,&local_1c);
    if (!bVar1) {
      return false;
    }
  }
  else if (requireName) {
    return false;
  }
  uVar2 = local_1c;
  local_1c = local_1c + 1;
  TVar3 = ParserBase::peek(&this->super_ParserBase,uVar2);
  if (TVar3.kind != OpenParenthesis) {
    return false;
  }
  TVar3 = ParserBase::peek(&this->super_ParserBase,local_1c);
  bVar1 = slang::syntax::SyntaxFacts::isDriveStrength(TVar3.kind);
  return !bVar1;
}

Assistant:

bool Parser::isHierarchyInstantiation(bool requireName) {
    uint32_t index = 0;
    if (peek(index++).kind != TokenKind::Identifier)
        return false;

    // skip over std::optional parameter value assignment
    if (peek(index).kind == TokenKind::Hash) {
        if (peek(++index).kind != TokenKind::OpenParenthesis)
            return false;

        index++;
        if (!scanTypePart<isNotInType>(index, TokenKind::OpenParenthesis,
                                       TokenKind::CloseParenthesis)) {
            return false;
        }
    }

    if (peek(index).kind == TokenKind::Identifier) {
        index++;
        if (!scanDimensionList(index))
            return false;
    }
    else if (requireName) {
        return false;
    }

    // A parenthesis here indicates a start of a hierarchical instantiation,
    // unless there's a drive strength token immediately after it.
    if (peek(index++).kind != TokenKind::OpenParenthesis)
        return false;

    return !isDriveStrength(peek(index).kind);
}